

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Cpu.cpp
# Opt level: O0

Timer * __thiscall Snes_Spc::run_timer_(Snes_Spc *this,Timer *t,rel_time_t time)

{
  int iVar1;
  int iVar2;
  int n;
  int over;
  int divider;
  int remain;
  int elapsed;
  rel_time_t time_local;
  Timer *t_local;
  Snes_Spc *this_local;
  
  iVar1 = (time - t->next_time) / t->prescaler + 1;
  t->next_time = iVar1 * t->prescaler + t->next_time;
  if (t->enabled != 0) {
    divider = t->divider + iVar1;
    iVar1 = iVar1 - (((t->period - t->divider) - 1U & 0xff) + 1);
    if (-1 < iVar1) {
      iVar2 = iVar1 / t->period;
      t->counter = t->counter + 1 + iVar2 & 0xf;
      divider = iVar1 - iVar2 * t->period;
    }
    t->divider = divider & 0xff;
  }
  return t;
}

Assistant:

Snes_Spc::Timer* Snes_Spc::run_timer_( Timer* t, rel_time_t time )
{
	int elapsed = TIMER_DIV( t, time - t->next_time ) + 1;
	t->next_time += TIMER_MUL( t, elapsed );
	
	if ( t->enabled )
	{
		int remain = IF_0_THEN_256( t->period - t->divider );
		int divider = t->divider + elapsed;
		int over = elapsed - remain;
		if ( over >= 0 )
		{
			int n = over / t->period;
			t->counter = (t->counter + 1 + n) & 0x0F;
			divider = over - n * t->period;
		}
		t->divider = (uint8_t) divider;
	}
	return t;
}